

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

HashErr lookup_symbol(SymbolTable *s,char *name,SymbolInfo *val,char **original_name_ptr)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  Symbol *pSVar7;
  
  cVar1 = *name;
  if (cVar1 == '\0') {
    uVar4 = 0;
  }
  else {
    pcVar3 = name + 1;
    uVar4 = 0;
    cVar5 = cVar1;
    do {
      uVar4 = uVar4 + (long)cVar5;
      uVar4 = (uVar4 >> 2) + (long)cVar5 + uVar4 * 8;
      cVar5 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar5 != '\0');
    uVar4 = uVar4 % 0xfd;
  }
  iVar6 = s->bucket[uVar4]->num_symbols;
  if (0 < iVar6) {
    pSVar7 = s->bucket[uVar4]->symbol;
    iVar6 = iVar6 + 1;
    do {
      if ((cVar1 == *pSVar7->name) && (iVar2 = strcmp(name,pSVar7->name), iVar2 == 0)) {
        if (val != (SymbolInfo *)0x0) {
          *val = pSVar7->value;
        }
        if (original_name_ptr == (char **)0x0) {
          return HASH_NOERR;
        }
        *original_name_ptr = pSVar7->name;
        return HASH_NOERR;
      }
      pSVar7 = pSVar7 + 1;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return HASH_NOTFOUND;
}

Assistant:

HashErr
lookup_symbol (const SymbolTable *s, const char *name, SymbolInfo *val,
	       const char **original_name_ptr)
{
  int i, bucket_num = hash_code (name);
  Bucket *b = s->bucket[bucket_num];
  Symbol *sym;
  char firstc = *name;

  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      {
	if (val != NULL)
	  *val = sym->value;
	if (original_name_ptr != NULL)
	  *original_name_ptr = sym->name;
	return HASH_NOERR;
      }

  return HASH_NOTFOUND;
}